

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cpp
# Opt level: O2

void __thiscall Reader::processboundssec(Reader *this)

{
  ProcessedToken *pPVar1;
  map<LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>,_std::less<LpSectionKeyword>,_std::allocator<std::pair<const_LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>_>_>_>
  *this_00;
  Builder *name_00;
  anon_union_8_5_ebd6940d_for_ProcessedToken_1 aVar2;
  anon_union_8_5_ebd6940d_for_ProcessedToken_1 aVar3;
  LpSectionKeyword LVar4;
  ProcessedToken *pPVar5;
  ProcessedToken *pPVar6;
  size_type sVar7;
  mapped_type *pmVar8;
  mapped_type *pmVar9;
  double *pdVar10;
  ProcessedToken *pPVar11;
  ProcessedToken *pPVar12;
  ProcessedToken *pPVar13;
  LpSectionKeyword LVar14;
  undefined4 uVar15;
  shared_ptr<Variable> var;
  string name;
  
  this_00 = &this->sectiontokens;
  name._M_dataplus._M_p._0_4_ = 4;
  sVar7 = std::
          map<LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>,_std::less<LpSectionKeyword>,_std::allocator<std::pair<const_LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>_>_>_>
          ::count(this_00,(key_type *)&name);
  if (sVar7 != 0) {
    name._M_dataplus._M_p._0_4_ = 4;
    pmVar8 = std::
             map<LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>,_std::less<LpSectionKeyword>,_std::allocator<std::pair<const_LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>_>_>_>
             ::operator[](this_00,(key_type *)&name);
    name._M_dataplus._M_p._0_4_ = 4;
    pmVar9 = std::
             map<LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>,_std::less<LpSectionKeyword>,_std::allocator<std::pair<const_LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>_>_>_>
             ::operator[](this_00,(key_type *)&name);
    name_00 = &this->builder;
    while( true ) {
      pPVar5 = (pmVar8->first)._M_current;
      pPVar6 = (pmVar9->second)._M_current;
      if (pPVar5 == pPVar6) break;
      pPVar1 = pPVar5 + 1;
      pPVar11 = pPVar1;
      if (pPVar1 == pPVar6) {
LAB_002107ee:
        pPVar12 = pPVar11 + (pPVar11 != pPVar6);
        pPVar13 = pPVar12 + (pPVar12 != pPVar6);
        if ((((pPVar13 != pPVar6) && (pPVar5->type == CONST)) && (pPVar1->type == COMP)) &&
           (((pPVar11->type == VARID && (pPVar12->type == COMP)) && (pPVar13->type == CONST)))) {
          lpassert(pPVar5[1].field_1.keyword == NONE);
          lpassert((pPVar12->field_1).keyword == NONE);
          aVar2 = ((pmVar8->first)._M_current)->field_1;
          aVar3 = pPVar13->field_1;
          std::__cxx11::string::string((string *)&name,(pPVar11->field_1).name,(allocator *)&var);
          Builder::getvarbyname((Builder *)&var,(string *)name_00);
          (var.super___shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->lowerbound =
               (double)aVar2;
          (var.super___shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->upperbound =
               (double)aVar3;
          (pmVar8->first)._M_current = pPVar13 + 1;
          goto LAB_002107d6;
        }
        if (pPVar11 == pPVar6) {
LAB_002109ea:
          lpassert(false);
        }
        else {
          if (pPVar5->type == VARID) {
            if ((pPVar1->type != COMP) || (pPVar11->type != CONST)) goto LAB_002109ea;
            aVar2 = pPVar11->field_1;
            std::__cxx11::string::string((string *)&name,(pPVar5->field_1).name,(allocator *)&var);
            Builder::getvarbyname((Builder *)&var,(string *)name_00);
            LVar4 = pPVar5[1].field_1.keyword;
            lpassert((LVar4 & ~OBJMAX) != OBJMIN);
            LVar14 = aVar2.keyword;
            uVar15 = aVar2._4_4_;
            if (LVar4 != NONE) {
              if (LVar4 == OBJMAX) goto LAB_002109f6;
              if (LVar4 != BOUNDS) {
                lpassert(false);
                goto LAB_00210a11;
              }
              goto LAB_002109ff;
            }
LAB_00210a05:
            pdVar10 = &(var.super___shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                       upperbound;
LAB_00210a0d:
            *pdVar10 = (double)CONCAT44(uVar15,LVar14);
          }
          else {
            if (((pPVar5->type != CONST) || (pPVar1->type != COMP)) || (pPVar11->type != VARID))
            goto LAB_002109ea;
            aVar2 = pPVar5->field_1;
            std::__cxx11::string::string((string *)&name,(pPVar11->field_1).name,(allocator *)&var);
            Builder::getvarbyname((Builder *)&var,(string *)name_00);
            LVar4 = pPVar5[1].field_1.keyword;
            lpassert((LVar4 & ~OBJMAX) != OBJMIN);
            LVar14 = aVar2.keyword;
            uVar15 = aVar2._4_4_;
            if (LVar4 == NONE) {
LAB_002109ff:
              pdVar10 = &(var.super___shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                         lowerbound;
              goto LAB_00210a0d;
            }
            if (LVar4 == OBJMAX) {
LAB_002109f6:
              (var.super___shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->upperbound =
                   (double)CONCAT44(uVar15,LVar14);
              goto LAB_002109ff;
            }
            if (LVar4 == BOUNDS) goto LAB_00210a05;
            lpassert(false);
          }
LAB_00210a11:
          (pmVar8->first)._M_current = pPVar12;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&var.super___shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          std::__cxx11::string::~string((string *)&name);
        }
      }
      else {
        if ((pPVar5->type != VARID) || (pPVar1->type != FREE)) {
          pPVar11 = pPVar5 + 2;
          goto LAB_002107ee;
        }
        std::__cxx11::string::string((string *)&name,(pPVar5->field_1).name,(allocator *)&var);
        Builder::getvarbyname((Builder *)&var,(string *)name_00);
        (var.super___shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->lowerbound =
             -INFINITY;
        (var.super___shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->upperbound = INFINITY
        ;
        (pmVar8->first)._M_current = pPVar5 + 2;
LAB_002107d6:
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&var.super___shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        std::__cxx11::string::~string((string *)&name);
      }
    }
  }
  return;
}

Assistant:

void Reader::processboundssec() {
  if (!sectiontokens.count(LpSectionKeyword::BOUNDS)) return;
  std::vector<ProcessedToken>::iterator& begin(
      sectiontokens[LpSectionKeyword::BOUNDS].first);
  std::vector<ProcessedToken>::iterator& end(
      sectiontokens[LpSectionKeyword::BOUNDS].second);
  while (begin != end) {
    std::vector<ProcessedToken>::iterator next1 = begin;  // token after begin
    ++next1;

    // VAR free
    if (next1 != end && begin->type == ProcessedTokenType::VARID &&
        next1->type == ProcessedTokenType::FREE) {
      std::string name = begin->name;
      std::shared_ptr<Variable> var = builder.getvarbyname(name);
      var->lowerbound = -kHighsInf;
      var->upperbound = kHighsInf;
      begin = ++next1;
      continue;
    }

    std::vector<ProcessedToken>::iterator next2 =
        next1;  // token 2nd-after begin
    std::vector<ProcessedToken>::iterator next3 =
        next1;  // token 3rd-after begin
    std::vector<ProcessedToken>::iterator next4 =
        next1;  // token 4th-after begin
    if (next1 != end) {
      ++next2;
      ++next3;
      ++next4;
    }
    if (next2 != end) {
      ++next3;
      ++next4;
    }
    if (next3 != end) ++next4;

    // CONST COMP VAR COMP CONST
    if (next4 != end && begin->type == ProcessedTokenType::CONST &&
        next1->type == ProcessedTokenType::COMP &&
        next2->type == ProcessedTokenType::VARID &&
        next3->type == ProcessedTokenType::COMP &&
        next4->type == ProcessedTokenType::CONST) {
      lpassert(next1->dir == LpComparisonType::LEQ);
      lpassert(next3->dir == LpComparisonType::LEQ);

      double lb = begin->value;
      double ub = next4->value;

      std::string name = next2->name;
      std::shared_ptr<Variable> var = builder.getvarbyname(name);

      var->lowerbound = lb;
      var->upperbound = ub;

      begin = ++next4;
      continue;
    }

    // CONST COMP VAR
    if (next2 != end && begin->type == ProcessedTokenType::CONST &&
        next1->type == ProcessedTokenType::COMP &&
        next2->type == ProcessedTokenType::VARID) {
      double value = begin->value;
      std::string name = next2->name;
      std::shared_ptr<Variable> var = builder.getvarbyname(name);
      LpComparisonType dir = next1->dir;

      lpassert(dir != LpComparisonType::L && dir != LpComparisonType::G);

      switch (dir) {
        case LpComparisonType::LEQ:
          var->lowerbound = value;
          break;
        case LpComparisonType::GEQ:
          var->upperbound = value;
          break;
        case LpComparisonType::EQ:
          var->lowerbound = var->upperbound = value;
          break;
        default:
          lpassert(false);
      }
      begin = next3;
      continue;
    }

    // VAR COMP CONST
    if (next2 != end && begin->type == ProcessedTokenType::VARID &&
        next1->type == ProcessedTokenType::COMP &&
        next2->type == ProcessedTokenType::CONST) {
      double value = next2->value;
      std::string name = begin->name;
      std::shared_ptr<Variable> var = builder.getvarbyname(name);
      LpComparisonType dir = next1->dir;

      lpassert(dir != LpComparisonType::L && dir != LpComparisonType::G);

      switch (dir) {
        case LpComparisonType::LEQ:
          var->upperbound = value;
          break;
        case LpComparisonType::GEQ:
          var->lowerbound = value;
          break;
        case LpComparisonType::EQ:
          var->lowerbound = var->upperbound = value;
          break;
        default:
          lpassert(false);
      }
      begin = next3;
      continue;
    }

    lpassert(false);
  }
}